

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O0

err_t sigExtr(int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 *in_RSI;
  int in_EDI;
  char *scope;
  err_t code;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int count;
  err_t local_4;
  
  if (in_EDI == 3) {
    pcVar1 = (char *)*in_RSI;
    sVar2 = strLen((char *)0x114ed8);
    if ((sVar2 == 0) || (*pcVar1 != '-')) {
      local_4 = 0x25b;
    }
    else {
      count = (int)in_RSI + 8;
      local_4 = cmdFileValExist(count,(char **)CONCAT44(in_stack_ffffffffffffffec,
                                                        in_stack_ffffffffffffffe8));
      if ((local_4 == 0) &&
         (local_4 = cmdFileValNotExist(count,(char **)(ulong)in_stack_ffffffffffffffe8),
         local_4 == 0)) {
        local_4 = cmdSigExtr(in_stack_00000038,in_stack_00000030,in_stack_00000028);
      }
    }
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

static err_t sigExtr(int argc, char* argv[])
{
	err_t code;
	const char* scope;
	// обработать опции
	if (argc != 3)
		return ERR_CMD_PARAMS;
	scope = argv[0];
	if (strLen(scope) < 1 || scope[0] != '-')
		return ERR_CMD_PARAMS;
	++scope, --argc, ++argv;
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	code = cmdFileValNotExist(1, argv + 1);
	ERR_CALL_CHECK(code);
	// извлечь объект
	code = cmdSigExtr(argv[1], argv[0], scope);
	// завершить
	return code;
}